

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzer.cpp
# Opt level: O3

void __thiscall ManchesterAnalyzer::SynchronizeDifferential(ManchesterAnalyzer *this)

{
  unsigned_long_long *puVar1;
  U32 UVar2;
  U32 UVar3;
  pointer ppVar4;
  pointer puVar5;
  long lVar6;
  unsigned_long_long *puVar7;
  U64 location;
  ulong uVar8;
  ulong uVar9;
  unsigned_long_long *puVar10;
  unsigned_long_long *puVar11;
  ulong uVar12;
  iterator iVar13;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> locations_to_save;
  U64 edge_location;
  unsigned_long_long *local_48;
  iterator iStack_40;
  unsigned_long_long *local_38;
  unsigned_long_long local_30;
  
  if (this->mSynchronized == false) {
    do {
      Analyzer::CheckIfThreadShouldExit();
      local_30 = AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToNextEdge();
      location = AnalyzerChannelData::GetSampleNumber();
      uVar9 = location - local_30;
      UVar2 = this->mT;
      UVar3 = this->mTError;
      if (uVar9 < UVar3 + UVar2 && UVar2 - UVar3 < uVar9) {
        iVar13._M_current =
             (this->mUnsyncedLocations).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar13._M_current ==
            (this->mUnsyncedLocations).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
          _M_realloc_insert<unsigned_long_long_const&>
                    ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
                     &this->mUnsyncedLocations,iVar13,&local_30);
        }
        else {
          *iVar13._M_current = local_30;
          (this->mUnsyncedLocations).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar13._M_current + 1;
        }
      }
      else {
        if (uVar9 < UVar3 + UVar2 * 2 && UVar2 * 2 - UVar3 < uVar9) {
          iVar13._M_current =
               (this->mUnsyncedLocations).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar13._M_current ==
              (this->mUnsyncedLocations).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
            _M_realloc_insert<unsigned_long_long_const&>
                      ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
                       &this->mUnsyncedLocations,iVar13,&local_30);
            puVar11 = (this->mUnsyncedLocations).
                      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            *iVar13._M_current = local_30;
            puVar11 = iVar13._M_current + 1;
            (this->mUnsyncedLocations).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_finish = puVar11;
          }
          this->mSynchronized = true;
          puVar10 = (this->mUnsyncedLocations).
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_48 = (unsigned_long_long *)0x0;
          iStack_40._M_current = (unsigned_long_long *)0x0;
          local_38 = (unsigned_long_long *)0x0;
          uVar9 = (long)puVar11 - (long)puVar10;
          if (uVar9 == 0) {
            iVar13._M_current = (unsigned_long_long *)0x0;
          }
          else {
            do {
              if (iStack_40._M_current == local_38) {
                std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
                _M_realloc_insert<unsigned_long_long_const&>
                          ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
                           &local_48,iStack_40,puVar11 + -1);
                puVar10 = (this->mUnsyncedLocations).
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar11 = (this->mUnsyncedLocations).
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                *iStack_40._M_current = puVar11[-1];
                iStack_40._M_current = iStack_40._M_current + 1;
              }
              iVar13._M_current = iStack_40._M_current;
              puVar7 = local_48;
              puVar1 = puVar11 + -1;
              puVar11 = puVar11 + -2;
              if (puVar1 == puVar10) {
                puVar11 = puVar1;
              }
              (this->mUnsyncedLocations).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_finish = puVar11;
            } while (puVar11 != puVar10);
            if (local_48 != iStack_40._M_current) {
              uVar8 = (long)iStack_40._M_current - (long)local_48 >> 3;
              lVar6 = 0x3f;
              if (uVar8 != 0) {
                for (; uVar8 >> lVar6 == 0; lVar6 = lVar6 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long_long*,std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_48,iStack_40._M_current,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long_long*,std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (puVar7,iVar13._M_current);
              iVar13._M_current = local_48;
            }
          }
          uVar8 = (ulong)((long)iStack_40._M_current - (long)iVar13._M_current) >> 3;
          if ((int)uVar8 != 0) {
            uVar12 = 0;
            do {
              SaveBit(this,local_48[uVar12],(uint)(uVar12 == 0 & (byte)(uVar9 >> 3) & 0x1f));
              uVar12 = uVar12 + 1;
            } while ((uVar8 & 0xffffffff) != uVar12);
          }
          SaveBit(this,location,1);
          if (local_48 == (unsigned_long_long *)0x0) {
            return;
          }
          operator_delete(local_48);
          return;
        }
        this->mSynchronized = false;
        ppVar4 = (this->mBitsForNextByte).
                 super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->mBitsForNextByte).
            super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppVar4) {
          (this->mBitsForNextByte).
          super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar4;
        }
        puVar5 = (this->mUnsyncedLocations).
                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
                 .super__Vector_impl_data._M_start;
        if ((this->mUnsyncedLocations).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar5) {
          (this->mUnsyncedLocations).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar5;
        }
        this->mIgnoreBitCount = ((this->mSettings)._M_ptr)->mBitsToIgnore;
      }
    } while (this->mSynchronized == false);
  }
  return;
}

Assistant:

void ManchesterAnalyzer::SynchronizeDifferential()
{
    while( mSynchronized == false )
    {
        CheckIfThreadShouldExit();
        U64 edge_location = mManchester->GetSampleNumber();
        mManchester->AdvanceToNextEdge();
        U64 next_edge_location = mManchester->GetSampleNumber();
        U64 edge_distance = next_edge_location - edge_location;
        if( ( edge_distance > ( mT - mTError ) ) && ( edge_distance < ( mT + mTError ) ) ) // short
        {
            mUnsyncedLocations.push_back( edge_location );
        }
        else if( ( edge_distance > ( ( 2 * mT ) - mTError ) ) && ( edge_distance < ( ( 2 * mT ) + mTError ) ) ) // long
        {
            mUnsyncedLocations.push_back( edge_location );
            mSynchronized = true;

            bool last_bit_one = false;
            if( mUnsyncedLocations.size() % 2 == 1 )
                last_bit_one = true;
            std::vector<U64> locations_to_save;
            while( mUnsyncedLocations.size() > 0 )
            {
                locations_to_save.push_back( mUnsyncedLocations.back() );
                mUnsyncedLocations.pop_back();
                if( mUnsyncedLocations.size() > 0 )
                    mUnsyncedLocations.pop_back();
            }
            std::sort( locations_to_save.begin(), locations_to_save.end() );
            U32 count = locations_to_save.size();
            for( U32 i = 0; i < count; ++i )
            {
                if( ( i == 0 ) && ( last_bit_one == true ) )
                    SaveBit( locations_to_save[ i ], 1 );
                else
                    SaveBit( locations_to_save[ i ], 0 );
            }

            SaveBit( next_edge_location, 1 );
            break;
        }
        else
        {
            // back to idle.
            Invalidate();
        }
    }
}